

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUserDefinedIO.cpp
# Opt level: O1

string * vkt::tessellation::anon_unknown_1::glslTraverseBasicTypes
                   (string *__return_storage_ptr__,string *rootName,VarType *rootType,
                   int arrayNestingDepth,int indentationDepth,BasicTypeVisitFunc visit)

{
  Type TVar1;
  int iVar2;
  StructType *pSVar3;
  pointer pSVar4;
  pointer pcVar5;
  long *plVar6;
  undefined8 *puVar7;
  long *plVar8;
  size_type *psVar9;
  ulong *puVar10;
  undefined8 uVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  string loopIndexName;
  string indentation;
  string arrayLength;
  long *local_448;
  long local_440;
  long local_438;
  long lStack_430;
  string *local_428;
  string local_420;
  BasicTypeVisitFunc local_400;
  string *local_3f8;
  ulong *local_3f0;
  long local_3e8;
  ulong local_3e0;
  long lStack_3d8;
  long *local_3d0;
  undefined8 local_3c8;
  long local_3c0;
  undefined8 uStack_3b8;
  long *local_3b0;
  undefined8 local_3a8;
  long local_3a0;
  undefined8 uStack_398;
  long *local_390 [2];
  long local_380 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_370;
  long *local_368 [2];
  long local_358 [2];
  long *local_348 [2];
  long local_338 [2];
  ulong *local_328;
  long local_320;
  ulong local_318;
  undefined4 uStack_310;
  undefined4 uStack_30c;
  ulong *local_308;
  long local_300;
  ulong local_2f8 [2];
  long *local_2e8;
  long local_2e0;
  long local_2d8;
  long lStack_2d0;
  long *local_2c8;
  long local_2c0;
  long local_2b8;
  long lStack_2b0;
  long *local_2a8;
  long local_2a0;
  long local_298;
  long lStack_290;
  long *local_288;
  long local_280;
  long local_278;
  long lStack_270;
  long *local_268;
  long local_260;
  long local_258;
  long lStack_250;
  long *local_248;
  long local_240;
  long local_238;
  long lStack_230;
  string local_228;
  long *local_208;
  long local_200;
  long local_1f8;
  long lStack_1f0;
  long *local_1e8;
  long local_1e0;
  long local_1d8;
  long lStack_1d0;
  long *local_1c8;
  long local_1c0;
  long local_1b8;
  long lStack_1b0;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  TVar1 = rootType->m_type;
  local_428 = __return_storage_ptr__;
  local_400 = visit;
  local_3f8 = rootName;
  if (TVar1 == TYPE_STRUCT) {
    pSVar3 = (rootType->m_data).structPtr;
    uVar13 = (int)((long)(pSVar3->m_members).
                         super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(pSVar3->m_members).
                         super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 3) * -0x49249249;
    local_370 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_370;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    if ((int)uVar13 < 1) {
      return __return_storage_ptr__;
    }
    uVar14 = (ulong)(uVar13 & 0x7fffffff);
    lVar12 = 0x20;
    do {
      pSVar4 = (pSVar3->m_members).
               super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_448 = &local_438;
      pcVar5 = (local_3f8->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_448,pcVar5,pcVar5 + local_3f8->_M_string_length);
      std::__cxx11::string::append((char *)&local_448);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_448);
      psVar9 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_420.field_2._M_allocated_capacity = *psVar9;
        local_420.field_2._8_8_ = plVar6[3];
        local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
      }
      else {
        local_420.field_2._M_allocated_capacity = *psVar9;
        local_420._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_420._M_string_length = plVar6[1];
      *plVar6 = (long)psVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      glslTraverseBasicTypes
                (local_1a8,&local_420,(VarType *)((long)&(pSVar4->m_name)._M_dataplus._M_p + lVar12)
                 ,arrayNestingDepth,indentationDepth,local_400);
      std::__cxx11::string::_M_append((char *)local_428,(ulong)local_1a8[0]._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_420._M_dataplus._M_p != &local_420.field_2) {
        operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
      }
      if (local_448 != &local_438) {
        operator_delete(local_448,local_438 + 1);
      }
      lVar12 = lVar12 + 0x38;
      uVar14 = uVar14 - 1;
    } while (uVar14 != 0);
    return local_428;
  }
  if (TVar1 != TYPE_ARRAY) {
    if (TVar1 == TYPE_BASIC) {
      (*visit)(__return_storage_ptr__,rootName,(rootType->m_data).basic.type,indentationDepth);
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__throw_logic_error("basic_string::_M_construct null not valid");
  }
  local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_420,(char)indentationDepth);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::ostream::operator<<(local_1a8,arrayNestingDepth);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)local_390,0,(char *)0x0,0xb9a6af);
  local_448 = &local_438;
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_438 = *plVar8;
    lStack_430 = plVar6[3];
  }
  else {
    local_438 = *plVar8;
    local_448 = (long *)*plVar6;
  }
  local_440 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if (local_390[0] != local_380) {
    operator_delete(local_390[0],local_380[0] + 1);
  }
  iVar2 = (rootType->m_data).array.size;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::ostream::operator<<(local_1a8,iVar2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  local_348[0] = local_338;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_348,local_420._M_dataplus._M_p,
             local_420._M_dataplus._M_p + local_420._M_string_length);
  std::__cxx11::string::append((char *)local_348);
  plVar6 = (long *)std::__cxx11::string::_M_append((char *)local_348,(ulong)local_448);
  local_2e8 = &local_2d8;
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_2d8 = *plVar8;
    lStack_2d0 = plVar6[3];
  }
  else {
    local_2d8 = *plVar8;
    local_2e8 = (long *)*plVar6;
  }
  local_2e0 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_2e8);
  local_2c8 = &local_2b8;
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_2b8 = *plVar8;
    lStack_2b0 = plVar6[3];
  }
  else {
    local_2b8 = *plVar8;
    local_2c8 = (long *)*plVar6;
  }
  local_2c0 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_2c8,(ulong)local_448);
  local_2a8 = &local_298;
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_298 = *plVar8;
    lStack_290 = plVar6[3];
  }
  else {
    local_298 = *plVar8;
    local_2a8 = (long *)*plVar6;
  }
  local_2a0 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_2a8);
  puVar10 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar10) {
    local_3e0 = *puVar10;
    lStack_3d8 = plVar6[3];
    local_3f0 = &local_3e0;
  }
  else {
    local_3e0 = *puVar10;
    local_3f0 = (ulong *)*plVar6;
  }
  local_3e8 = plVar6[1];
  *plVar6 = (long)puVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  iVar2 = (rootType->m_data).array.size;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::ostream::operator<<(local_1a8,iVar2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  uVar14 = 0xf;
  if (local_3f0 != &local_3e0) {
    uVar14 = local_3e0;
  }
  if (uVar14 < (ulong)(local_300 + local_3e8)) {
    uVar14 = 0xf;
    if (local_308 != local_2f8) {
      uVar14 = local_2f8[0];
    }
    if (uVar14 < (ulong)(local_300 + local_3e8)) goto LAB_007a3bc3;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_308,0,(char *)0x0,(ulong)local_3f0);
  }
  else {
LAB_007a3bc3:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_3f0,(ulong)local_308);
  }
  local_3d0 = &local_3c0;
  plVar6 = puVar7 + 2;
  if ((long *)*puVar7 == plVar6) {
    local_3c0 = *plVar6;
    uStack_3b8 = puVar7[3];
  }
  else {
    local_3c0 = *plVar6;
    local_3d0 = (long *)*puVar7;
  }
  local_3c8 = puVar7[1];
  *puVar7 = plVar6;
  puVar7[1] = 0;
  *(undefined1 *)plVar6 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_3d0);
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_1f8 = *plVar8;
    lStack_1f0 = plVar6[3];
    local_208 = &local_1f8;
  }
  else {
    local_1f8 = *plVar8;
    local_208 = (long *)*plVar6;
  }
  local_200 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_208,(ulong)local_448);
  local_288 = &local_278;
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_278 = *plVar8;
    lStack_270 = plVar6[3];
  }
  else {
    local_278 = *plVar8;
    local_288 = (long *)*plVar6;
  }
  local_280 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_288);
  local_268 = &local_258;
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_258 = *plVar8;
    lStack_250 = plVar6[3];
  }
  else {
    local_258 = *plVar8;
    local_268 = (long *)*plVar6;
  }
  local_260 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_268,(ulong)local_420._M_dataplus._M_p);
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_1d8 = *plVar8;
    lStack_1d0 = plVar6[3];
    local_1e8 = &local_1d8;
  }
  else {
    local_1d8 = *plVar8;
    local_1e8 = (long *)*plVar6;
  }
  local_1e0 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_1e8);
  puVar10 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar10) {
    local_318 = *puVar10;
    uStack_310 = (undefined4)plVar6[3];
    uStack_30c = *(undefined4 *)((long)plVar6 + 0x1c);
    local_328 = &local_318;
  }
  else {
    local_318 = *puVar10;
    local_328 = (ulong *)*plVar6;
  }
  local_320 = plVar6[1];
  *plVar6 = (long)puVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_368[0] = local_358;
  pcVar5 = (local_3f8->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_368,pcVar5,pcVar5 + local_3f8->_M_string_length);
  std::__cxx11::string::append((char *)local_368);
  plVar6 = (long *)std::__cxx11::string::_M_append((char *)local_368,(ulong)local_448);
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_238 = *plVar8;
    lStack_230 = plVar6[3];
    local_248 = &local_238;
  }
  else {
    local_238 = *plVar8;
    local_248 = (long *)*plVar6;
  }
  local_240 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_248);
  psVar9 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_228.field_2._M_allocated_capacity = *psVar9;
    local_228.field_2._8_8_ = plVar6[3];
    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  }
  else {
    local_228.field_2._M_allocated_capacity = *psVar9;
    local_228._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_228._M_string_length = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  glslTraverseBasicTypes
            (local_1a8,&local_228,(rootType->m_data).array.elementType,arrayNestingDepth + 1,
             indentationDepth + 1,local_400);
  uVar14 = 0xf;
  if (local_328 != &local_318) {
    uVar14 = local_318;
  }
  if (uVar14 < local_1a8[0]._M_string_length + local_320) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      uVar11 = local_1a8[0].field_2._M_allocated_capacity;
    }
    if (local_1a8[0]._M_string_length + local_320 <= (ulong)uVar11) {
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)local_1a8,0,(char *)0x0,(ulong)local_328);
      goto LAB_007a3fdc;
    }
  }
  puVar7 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_328,(ulong)local_1a8[0]._M_dataplus._M_p);
LAB_007a3fdc:
  local_3b0 = &local_3a0;
  plVar6 = puVar7 + 2;
  if ((long *)*puVar7 == plVar6) {
    local_3a0 = *plVar6;
    uStack_398 = puVar7[3];
  }
  else {
    local_3a0 = *plVar6;
    local_3b0 = (long *)*puVar7;
  }
  local_3a8 = puVar7[1];
  *puVar7 = plVar6;
  puVar7[1] = 0;
  *(undefined1 *)plVar6 = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_3b0,(ulong)local_420._M_dataplus._M_p);
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_1b8 = *plVar8;
    lStack_1b0 = plVar6[3];
    local_1c8 = &local_1b8;
  }
  else {
    local_1b8 = *plVar8;
    local_1c8 = (long *)*plVar6;
  }
  local_1c0 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_1c8);
  (local_428->_M_dataplus)._M_p = (pointer)&local_428->field_2;
  psVar9 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar9) {
    lVar12 = plVar6[3];
    (local_428->field_2)._M_allocated_capacity = *psVar9;
    *(long *)((long)&local_428->field_2 + 8) = lVar12;
  }
  else {
    (local_428->_M_dataplus)._M_p = (pointer)*plVar6;
    (local_428->field_2)._M_allocated_capacity = *psVar9;
  }
  local_428->_M_string_length = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,local_1b8 + 1);
  }
  if (local_3b0 != &local_3a0) {
    operator_delete(local_3b0,local_3a0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if (local_248 != &local_238) {
    operator_delete(local_248,local_238 + 1);
  }
  if (local_368[0] != local_358) {
    operator_delete(local_368[0],local_358[0] + 1);
  }
  if (local_328 != &local_318) {
    operator_delete(local_328,local_318 + 1);
  }
  if (local_1e8 != &local_1d8) {
    operator_delete(local_1e8,local_1d8 + 1);
  }
  if (local_268 != &local_258) {
    operator_delete(local_268,local_258 + 1);
  }
  if (local_288 != &local_278) {
    operator_delete(local_288,local_278 + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
  if (local_3d0 != &local_3c0) {
    operator_delete(local_3d0,local_3c0 + 1);
  }
  if (local_308 != local_2f8) {
    operator_delete(local_308,local_2f8[0] + 1);
  }
  if (local_3f0 != &local_3e0) {
    operator_delete(local_3f0,local_3e0 + 1);
  }
  if (local_2a8 != &local_298) {
    operator_delete(local_2a8,local_298 + 1);
  }
  if (local_2c8 != &local_2b8) {
    operator_delete(local_2c8,local_2b8 + 1);
  }
  if (local_2e8 != &local_2d8) {
    operator_delete(local_2e8,local_2d8 + 1);
  }
  if (local_348[0] != local_338) {
    operator_delete(local_348[0],local_338[0] + 1);
  }
  if (local_390[0] != local_380) {
    operator_delete(local_390[0],local_380[0] + 1);
  }
  if (local_448 != &local_438) {
    operator_delete(local_448,local_438 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_420._M_dataplus._M_p != &local_420.field_2) {
    operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
  }
  return local_428;
}

Assistant:

std::string glslTraverseBasicTypes (const std::string&			rootName,
									const glu::VarType&			rootType,
									const int					arrayNestingDepth,
									const int					indentationDepth,
									const BasicTypeVisitFunc	visit)
{
	if (rootType.isBasicType())
		return visit(rootName, rootType.getBasicType(), indentationDepth);
	else if (rootType.isArrayType())
	{
		const std::string indentation	= std::string(indentationDepth, '\t');
		const std::string loopIndexName	= "i" + de::toString(arrayNestingDepth);
		const std::string arrayLength	= de::toString(rootType.getArraySize());
		return indentation + "for (int " + loopIndexName + " = 0; " + loopIndexName + " < " + de::toString(rootType.getArraySize()) + "; ++" + loopIndexName + ")\n" +
			   indentation + "{\n" +
			   glslTraverseBasicTypes(rootName + "[" + loopIndexName + "]", rootType.getElementType(), arrayNestingDepth+1, indentationDepth+1, visit) +
			   indentation + "}\n";
	}
	else if (rootType.isStructType())
	{
		const glu::StructType&	structType = *rootType.getStructPtr();
		const int				numMembers = structType.getNumMembers();
		std::string				result;

		for (int membNdx = 0; membNdx < numMembers; ++membNdx)
		{
			const glu::StructMember& member = structType.getMember(membNdx);
			result += glslTraverseBasicTypes(rootName + "." + member.getName(), member.getType(), arrayNestingDepth, indentationDepth, visit);
		}

		return result;
	}
	else
	{
		DE_ASSERT(false);
		return DE_NULL;
	}
}